

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qlistwidget.cpp
# Opt level: O0

void QListWidget::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  int iVar2;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  void *_v_1;
  void *_v;
  QListWidget *_t;
  undefined4 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  undefined1 enable;
  undefined4 in_stack_ffffffffffffff20;
  uint in_stack_ffffffffffffff24;
  QListWidgetItem *in_stack_ffffffffffffff30;
  QListWidget *in_stack_ffffffffffffff38;
  int *piVar3;
  undefined8 in_stack_ffffffffffffff50;
  int row;
  QListWidget *in_stack_ffffffffffffff58;
  
  row = (int)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  if (in_ESI == 0) {
    switch((QListWidgetItem *)(ulong)in_EDX) {
    case (QListWidgetItem *)0x0:
      itemPressed((QListWidget *)0x89f3ef,
                  (QListWidgetItem *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      break;
    case (QListWidgetItem *)0x1:
      itemClicked((QListWidget *)0x89f410,
                  (QListWidgetItem *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      break;
    case (QListWidgetItem *)0x2:
      itemDoubleClicked((QListWidget *)0x89f431,
                        (QListWidgetItem *)
                        CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      break;
    case (QListWidgetItem *)0x3:
      itemActivated((QListWidget *)0x89f452,
                    (QListWidgetItem *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)
                   );
      break;
    case (QListWidgetItem *)0x4:
      itemEntered((QListWidget *)0x89f473,
                  (QListWidgetItem *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      break;
    case (QListWidgetItem *)0x5:
      itemChanged((QListWidget *)0x89f494,
                  (QListWidgetItem *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      break;
    case (QListWidgetItem *)0x6:
      currentItemChanged((QListWidget *)
                         CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                         (QListWidgetItem *)(ulong)in_EDX,
                         (QListWidgetItem *)
                         CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
      break;
    case (QListWidgetItem *)0x7:
      currentTextChanged((QListWidget *)
                         CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                         (QString *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      break;
    case (QListWidgetItem *)0x8:
      currentRowChanged((QListWidget *)0x89f502,in_stack_ffffffffffffff1c);
      break;
    case (QListWidgetItem *)0x9:
      itemSelectionChanged((QListWidget *)0x89f511);
      break;
    case (QListWidgetItem *)0xa:
      scrollToItem(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,EnsureVisible);
      break;
    case (QListWidgetItem *)0xb:
      scrollToItem(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,EnsureVisible);
      break;
    case (QListWidgetItem *)0xc:
      clear((QListWidget *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    }
  }
  enable = (undefined1)((uint)in_stack_ffffffffffffff1c >> 0x18);
  if (in_ESI == 5) {
    bVar1 = QtMocHelpers::indexOfMethod<void(QListWidget::*)(QListWidgetItem*)>
                      (in_RCX,(void **)itemPressed,0,0);
    if (bVar1) {
      return;
    }
    bVar1 = QtMocHelpers::indexOfMethod<void(QListWidget::*)(QListWidgetItem*)>
                      (in_RCX,(void **)itemClicked,0,1);
    if (bVar1) {
      return;
    }
    bVar1 = QtMocHelpers::indexOfMethod<void(QListWidget::*)(QListWidgetItem*)>
                      (in_RCX,(void **)itemDoubleClicked,0,2);
    if (bVar1) {
      return;
    }
    bVar1 = QtMocHelpers::indexOfMethod<void(QListWidget::*)(QListWidgetItem*)>
                      (in_RCX,(void **)itemActivated,0,3);
    if (bVar1) {
      return;
    }
    bVar1 = QtMocHelpers::indexOfMethod<void(QListWidget::*)(QListWidgetItem*)>
                      (in_RCX,(void **)itemEntered,0,4);
    if (bVar1) {
      return;
    }
    bVar1 = QtMocHelpers::indexOfMethod<void(QListWidget::*)(QListWidgetItem*)>
                      (in_RCX,(void **)itemChanged,0,5);
    if (bVar1) {
      return;
    }
    bVar1 = QtMocHelpers::indexOfMethod<void(QListWidget::*)(QListWidgetItem*,QListWidgetItem*)>
                      (in_RCX,(void **)currentItemChanged,0,6);
    if (bVar1) {
      return;
    }
    bVar1 = QtMocHelpers::indexOfMethod<void(QListWidget::*)(QString_const&)>
                      (in_RCX,(void **)currentTextChanged,0,7);
    if (bVar1) {
      return;
    }
    row = 0;
    in_stack_ffffffffffffff58 = (QListWidget *)0x0;
    bVar1 = QtMocHelpers::indexOfMethod<void(QListWidget::*)(int)>
                      (in_RCX,(void **)currentRowChanged,0,8);
    if (bVar1) {
      return;
    }
    bVar1 = QtMocHelpers::indexOfMethod<void(QListWidget::*)()>
                      (in_RCX,(void **)itemSelectionChanged,0,9);
    if (bVar1) {
      return;
    }
  }
  if (in_ESI == 1) {
    piVar3 = *(int **)in_RCX;
    in_stack_ffffffffffffff24 = in_EDX;
    if (in_EDX == 0) {
      iVar2 = count((QListWidget *)in_stack_ffffffffffffff30);
      *piVar3 = iVar2;
    }
    else if (in_EDX == 1) {
      iVar2 = currentRow((QListWidget *)CONCAT44(1,in_stack_ffffffffffffff20));
      *piVar3 = iVar2;
    }
    else if (in_EDX == 2) {
      bVar1 = isSortingEnabled((QListWidget *)CONCAT44(2,in_stack_ffffffffffffff20));
      *(bool *)piVar3 = bVar1;
    }
  }
  if (in_ESI == 2) {
    if (in_EDX == 1) {
      setCurrentRow(in_stack_ffffffffffffff58,row);
    }
    else if (in_EDX == 2) {
      setSortingEnabled((QListWidget *)CONCAT44(in_stack_ffffffffffffff24,2),(bool)enable);
    }
  }
  return;
}

Assistant:

void QListWidget::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QListWidget *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->itemPressed((*reinterpret_cast< std::add_pointer_t<QListWidgetItem*>>(_a[1]))); break;
        case 1: _t->itemClicked((*reinterpret_cast< std::add_pointer_t<QListWidgetItem*>>(_a[1]))); break;
        case 2: _t->itemDoubleClicked((*reinterpret_cast< std::add_pointer_t<QListWidgetItem*>>(_a[1]))); break;
        case 3: _t->itemActivated((*reinterpret_cast< std::add_pointer_t<QListWidgetItem*>>(_a[1]))); break;
        case 4: _t->itemEntered((*reinterpret_cast< std::add_pointer_t<QListWidgetItem*>>(_a[1]))); break;
        case 5: _t->itemChanged((*reinterpret_cast< std::add_pointer_t<QListWidgetItem*>>(_a[1]))); break;
        case 6: _t->currentItemChanged((*reinterpret_cast< std::add_pointer_t<QListWidgetItem*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QListWidgetItem*>>(_a[2]))); break;
        case 7: _t->currentTextChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 8: _t->currentRowChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 9: _t->itemSelectionChanged(); break;
        case 10: _t->scrollToItem((*reinterpret_cast< std::add_pointer_t<const QListWidgetItem*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAbstractItemView::ScrollHint>>(_a[2]))); break;
        case 11: _t->scrollToItem((*reinterpret_cast< std::add_pointer_t<const QListWidgetItem*>>(_a[1]))); break;
        case 12: _t->clear(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QListWidget::*)(QListWidgetItem * )>(_a, &QListWidget::itemPressed, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QListWidget::*)(QListWidgetItem * )>(_a, &QListWidget::itemClicked, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QListWidget::*)(QListWidgetItem * )>(_a, &QListWidget::itemDoubleClicked, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QListWidget::*)(QListWidgetItem * )>(_a, &QListWidget::itemActivated, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QListWidget::*)(QListWidgetItem * )>(_a, &QListWidget::itemEntered, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QListWidget::*)(QListWidgetItem * )>(_a, &QListWidget::itemChanged, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QListWidget::*)(QListWidgetItem * , QListWidgetItem * )>(_a, &QListWidget::currentItemChanged, 6))
            return;
        if (QtMocHelpers::indexOfMethod<void (QListWidget::*)(const QString & )>(_a, &QListWidget::currentTextChanged, 7))
            return;
        if (QtMocHelpers::indexOfMethod<void (QListWidget::*)(int )>(_a, &QListWidget::currentRowChanged, 8))
            return;
        if (QtMocHelpers::indexOfMethod<void (QListWidget::*)()>(_a, &QListWidget::itemSelectionChanged, 9))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<int*>(_v) = _t->count(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->currentRow(); break;
        case 2: *reinterpret_cast<bool*>(_v) = _t->isSortingEnabled(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 1: _t->setCurrentRow(*reinterpret_cast<int*>(_v)); break;
        case 2: _t->setSortingEnabled(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}